

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzer.cpp
# Opt level: O2

void __thiscall MDIOAnalyzer::SetupResults(MDIOAnalyzer *this)

{
  MDIOAnalyzerResults *this_00;
  
  this_00 = (MDIOAnalyzerResults *)operator_new(0x20);
  MDIOAnalyzerResults::MDIOAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<MDIOAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void MDIOAnalyzer::SetupResults()
{
    mResults.reset( new MDIOAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mMdioChannel );
}